

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::custom_op<int>::custom_function<mxx::max<int>>
               (int *param_1,int *param_2,MPI_Datatype *param_3,int *param_4)

{
  int *piVar1;
  long local_60;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  int local_48;
  int inout_buf;
  int in_buf;
  int i;
  int *inout;
  int *in;
  MPI_Datatype *dt_local;
  int *len_local;
  void *inoutvec_local;
  void *invec_local;
  
  in = param_4;
  dt_local = param_3;
  len_local = param_2;
  inoutvec_local = param_1;
  if (1 < *(int *)param_3) {
    _in_buf = param_2;
    inout = param_1;
    for (inout_buf = 0; inout_buf < *(int *)dt_local + -1; inout_buf = inout_buf + 1) {
      piVar1 = max<int>::operator()
                         ((max<int> *)((long)&invec_local + 7),inout + inout_buf,_in_buf + inout_buf
                         );
      _in_buf[inout_buf] = *piVar1;
    }
  }
  MPI_Type_get_true_extent(*(undefined8 *)in,&local_60,&true_lb);
  memcpy((void *)((long)&local_48 + local_60),
         (void *)((long)inoutvec_local + (long)(*(int *)dt_local + -1) * 4),true_lb);
  memcpy((void *)((long)&true_extent + local_60 + 4),len_local + (*(int *)dt_local + -1),true_lb);
  piVar1 = max<int>::operator()
                     ((max<int> *)((long)&invec_local + 7),&local_48,(int *)((long)&true_extent + 4)
                     );
  true_extent._4_4_ = *piVar1;
  memcpy(len_local + (*(int *)dt_local + -1),(void *)((long)&true_extent + local_60 + 4),true_lb);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }